

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O1

_Bool modify_panel(term_conflict *t,wchar_t wy,wchar_t wx)

{
  uint32_t *puVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  if ((term_conflict *)angband_term[0] == t) {
    wVar3 = Term->hgt - (row_top_map[Term->sidebar_mode] + row_bottom_map[Term->sidebar_mode]);
  }
  else {
    wVar3 = t->hgt;
  }
  if ((term_conflict *)angband_term[0] == t) {
    wVar4 = ~col_map[Term->sidebar_mode] + Term->wid;
  }
  else {
    wVar4 = t->wid;
  }
  wVar3 = cave->height - wVar3 / (int)(uint)tile_height;
  if (wy <= wVar3) {
    wVar3 = wy;
  }
  if (wVar3 < L'\x01') {
    wVar3 = L'\0';
  }
  wVar4 = cave->width - wVar4 / (int)(uint)tile_width;
  if (wx <= wVar4) {
    wVar4 = wx;
  }
  if (wVar4 < L'\x01') {
    wVar4 = L'\0';
  }
  _Var2 = panel_should_modify(t,wVar3,wVar4);
  if (_Var2) {
    t->offset_y = wVar3;
    t->offset_x = wVar4;
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x10000;
  }
  return _Var2;
}

Assistant:

bool modify_panel(term *t, int wy, int wx)
{
	int dungeon_hgt = cave->height;
	int dungeon_wid = cave->width;
	int screen_hgt = (t == angband_term[0]) ?
		SCREEN_HGT : t->hgt / tile_height;
	int screen_wid = (t == angband_term[0]) ?
		SCREEN_WID : t->wid / tile_width;

	/* Verify wy, adjust if needed */
	if (wy > dungeon_hgt - screen_hgt) wy = dungeon_hgt - screen_hgt;
	if (wy < 0) wy = 0;

	/* Verify wx, adjust if needed */
	if (wx > dungeon_wid - screen_wid) wx = dungeon_wid - screen_wid;
	if (wx < 0) wx = 0;

	/* React to changes */
	if (panel_should_modify(t, wy, wx)) {
		/* Save wy, wx */
		t->offset_y = wy;
		t->offset_x = wx;

		/* Redraw map */
		player->upkeep->redraw |= (PR_MAP);

		/* Changed */
		return (true);
	}

	/* No change */
	return (false);
}